

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlChar * xmlEncodeSpecialChars(xmlDoc *doc,xmlChar *input)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  if (input != (xmlChar *)0x0) {
    uVar6 = 1000;
    pbVar3 = (byte *)(*xmlMalloc)(1000);
    pbVar5 = pbVar3;
    if (pbVar3 == (byte *)0x0) {
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeSpecialChars: malloc failed");
      return (xmlChar *)0x0;
    }
    do {
      if (*input == 0) {
        *pbVar3 = 0;
        return pbVar5;
      }
      lVar7 = (long)pbVar3 - (long)pbVar5;
      if (uVar6 < lVar7 + 10U) {
        if ((long)uVar6 < 0) {
          bVar8 = true;
          bVar2 = false;
        }
        else {
          pbVar4 = (byte *)(*xmlRealloc)(pbVar5,uVar6 * 2);
          bVar8 = pbVar4 == (byte *)0x0;
          if (!bVar8) {
            uVar6 = uVar6 * 2;
          }
          bVar2 = !bVar8;
          if (!bVar8) {
            pbVar5 = pbVar4;
          }
        }
        if (bVar2) {
          pbVar3 = pbVar5 + lVar7;
          goto LAB_00146bdd;
        }
      }
      else {
LAB_00146bdd:
        bVar1 = *input;
        if (bVar1 < 0x26) {
          if (bVar1 == 0xd) {
            pbVar3[0] = 0x26;
            pbVar3[1] = 0x23;
            pbVar3[2] = 0x31;
            pbVar3[3] = 0x33;
            goto LAB_00146c35;
          }
          if (bVar1 == 0x22) {
            pbVar3[0] = 0x26;
            pbVar3[1] = 0x71;
            pbVar3[2] = 0x75;
            pbVar3[3] = 0x6f;
            pbVar3[4] = 0x74;
            pbVar3[5] = 0x3b;
            pbVar3 = pbVar3 + 6;
          }
          else {
LAB_00146c3f:
            *pbVar3 = bVar1;
            pbVar3 = pbVar3 + 1;
          }
        }
        else if (bVar1 == 0x26) {
          pbVar3[0] = 0x26;
          pbVar3[1] = 0x61;
          pbVar3[2] = 0x6d;
          pbVar3[3] = 0x70;
LAB_00146c35:
          pbVar3[4] = 0x3b;
          pbVar3 = pbVar3 + 5;
        }
        else {
          if (bVar1 == 0x3e) {
            pbVar3[0] = 0x26;
            pbVar3[1] = 0x67;
            pbVar3[2] = 0x74;
            pbVar3[3] = 0x3b;
          }
          else {
            if (bVar1 != 0x3c) goto LAB_00146c3f;
            pbVar3[0] = 0x26;
            pbVar3[1] = 0x6c;
            pbVar3[2] = 0x74;
            pbVar3[3] = 0x3b;
          }
          pbVar3 = pbVar3 + 4;
        }
        input = input + 1;
        bVar8 = false;
      }
    } while (!bVar8);
    if (!bVar8) {
      return pbVar5;
    }
    __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"xmlEncodeSpecialChars: realloc failed");
    (*xmlFree)(pbVar5);
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlEncodeSpecialChars(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlChar *input) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    if (input == NULL) return(NULL);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size * sizeof(xmlChar));
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeSpecialChars: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 10 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (*cur == '"') {
	    *out++ = '&';
	    *out++ = 'q';
	    *out++ = 'u';
	    *out++ = 'o';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '\r') {
	    *out++ = '&';
	    *out++ = '#';
	    *out++ = '1';
	    *out++ = '3';
	    *out++ = ';';
	} else {
	    /*
	     * Works because on UTF-8, all extended sequences cannot
	     * result in bytes in the ASCII range.
	     */
	    *out++ = *cur;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeSpecialChars: realloc failed");
    xmlFree(buffer);
    return(NULL);
}